

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_nw_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i alVar3;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [24];
  long lVar16;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  longlong lVar17;
  longlong lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  longlong lVar25;
  longlong lVar26;
  longlong lVar27;
  longlong lVar28;
  longlong lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  __m256i vH_1;
  int64_t tmp2;
  int64_t tmp_2;
  __m256i *pv;
  __m256i *vP;
  __m256i vH;
  __m256i vF;
  __m256i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_64_t e;
  __m256i_64_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t score;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  int64_t *boundary;
  __m256i *pvE;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  ulong local_848;
  int64_t local_840;
  long local_838;
  long local_830;
  longlong local_820;
  longlong lStackY_818;
  longlong lStackY_810;
  undefined8 in_stack_fffffffffffff7f8;
  ulong in_stack_fffffffffffff800;
  ulong in_stack_fffffffffffff808;
  __m256i *palVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  longlong lStack_7c8;
  undefined1 local_7c0 [32];
  longlong local_7a0;
  longlong lStack_798;
  longlong lStack_790;
  longlong lStack_788;
  longlong local_760 [4];
  longlong local_740 [6];
  int local_710;
  int local_70c;
  parasail_result_t *local_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  ulong local_678;
  ulong local_670;
  ulong local_668;
  undefined1 local_660 [16];
  undefined1 auStack_650 [16];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  int64_t *local_620;
  __m256i *local_618;
  __m256i *local_610;
  __m256i *local_608;
  long local_600;
  int local_5f8;
  int local_5f4;
  int local_5f0;
  int local_5ec;
  long local_5e8;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  int local_5c0;
  int local_5bc;
  long local_5b8;
  parasail_result_t *local_5a8;
  ulong local_5a0;
  ulong local_598;
  ulong local_590;
  ulong local_588;
  longlong local_580;
  longlong lStack_578;
  longlong lStack_570;
  longlong lStack_568;
  __m256i *local_548;
  longlong local_540;
  longlong lStack_538;
  longlong lStack_530;
  longlong lStack_528;
  __m256i *local_508;
  longlong local_500;
  longlong lStack_4f8;
  longlong lStack_4f0;
  longlong lStack_4e8;
  __m256i *local_4c8;
  __m256i *local_488;
  __m256i *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  longlong local_420;
  longlong lStack_418;
  longlong lStack_410;
  longlong lStack_408;
  __m256i *local_3e8;
  __m256i *local_3e0;
  __m256i *local_3d8;
  __m256i *local_3d0;
  undefined1 (*local_3c8) [32];
  undefined1 local_3c0 [16];
  undefined1 auStack_3b0 [16];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  longlong local_360;
  longlong lStack_358;
  longlong lStack_350;
  longlong lStack_348;
  undefined1 local_340 [16];
  undefined1 auStack_330 [16];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  longlong lStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  longlong local_2a0;
  longlong lStack_298;
  longlong lStack_290;
  longlong lStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  undefined1 local_100 [32];
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  undefined1 local_80 [32];
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_5c8 = 0;
  local_5cc = 0;
  local_5d0 = 0;
  local_5d4 = 0;
  local_5d8 = 0;
  local_5dc = 0;
  local_5e8 = 0;
  local_5ec = 0;
  local_5f0 = 0;
  local_5f4 = 0;
  local_5f8 = 0;
  local_600 = 0;
  local_608 = (__m256i *)0x0;
  local_610 = (__m256i *)0x0;
  local_618 = (__m256i *)0x0;
  local_620 = (int64_t *)0x0;
  local_668 = 0;
  local_670 = 0;
  local_678 = 0;
  local_708 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_striped_profile_avx2_256_64","profile");
    local_5a8 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x60) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_striped_profile_avx2_256_64",
            "profile->profile64.score");
    local_5a8 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_striped_profile_avx2_256_64","profile->matrix");
    local_5a8 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_striped_profile_avx2_256_64",
            "profile->s1Len");
    local_5a8 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_striped_profile_avx2_256_64","s2");
    local_5a8 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_striped_profile_avx2_256_64","s2Len");
    local_5a8 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_striped_profile_avx2_256_64","open");
    local_5a8 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_striped_profile_avx2_256_64","gap");
    local_5a8 = (parasail_result_t *)0x0;
  }
  else {
    local_5c8 = 0;
    local_5cc = 0;
    local_5d0 = 0;
    local_5d4 = *(int *)(in_RDI + 8);
    local_5d8 = local_5d4 + -1;
    local_5dc = in_EDX + -1;
    local_5e8 = *(long *)(in_RDI + 0x10);
    local_5ec = 4;
    local_5f0 = (local_5d4 + 3) / 4;
    local_5f4 = (local_5d4 + -1) % local_5f0;
    local_5f8 = ~((local_5d4 + -1) / local_5f0) + 4;
    local_600 = *(long *)(in_RDI + 0x60);
    local_588 = (ulong)in_ECX;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_588;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_588;
    local_140 = vpunpcklqdq_avx(auVar19,auVar30);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_588;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_588;
    auStack_130 = vpunpcklqdq_avx(auVar31,auVar36);
    local_640 = local_140._0_8_;
    uStack_638 = local_140._8_8_;
    uStack_630 = auStack_130._0_8_;
    uStack_628 = auStack_130._8_8_;
    local_590 = (ulong)in_R8D;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_590;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_590;
    auVar19 = vpunpcklqdq_avx(auVar20,auVar32);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_590;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_590;
    auVar20 = vpunpcklqdq_avx(auVar21,auVar37);
    local_100._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar20;
    local_100._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar19;
    if (-in_ECX < *(int *)(local_5e8 + 0x20)) {
      lVar16 = (long)in_ECX;
    }
    else {
      lVar16 = -(long)*(int *)(local_5e8 + 0x20);
    }
    local_678 = lVar16 + 0x8000000000000001;
    local_670 = 0x7ffffffffffffffe - (long)*(int *)(local_5e8 + 0x1c);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_678;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_678;
    local_c0 = vpunpcklqdq_avx(auVar22,auVar33);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_678;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_678;
    auStack_b0 = vpunpcklqdq_avx(auVar34,auVar38);
    local_6a0 = local_c0._0_8_;
    uStack_698 = local_c0._8_8_;
    uStack_690 = auStack_b0._0_8_;
    uStack_688 = auStack_b0._8_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_670;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_670;
    auVar19 = vpunpcklqdq_avx(auVar23,auVar35);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_670;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_670;
    auVar20 = vpunpcklqdq_avx(auVar24,auVar39);
    local_80._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar20;
    local_80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar19;
    local_700 = local_c0._0_8_;
    uStack_6f8 = local_c0._8_8_;
    uStack_6f0 = auStack_b0._0_8_;
    uStack_6e8 = auStack_b0._8_8_;
    local_668 = local_678;
    local_5c4 = in_R8D;
    local_5c0 = in_ECX;
    local_5bc = in_EDX;
    local_5b8 = in_RSI;
    local_5a0 = local_670;
    local_598 = local_678;
    local_120 = local_588;
    local_118 = local_588;
    local_110 = local_588;
    local_108 = local_588;
    local_e0 = local_590;
    local_d8 = local_590;
    local_d0 = local_590;
    local_c8 = local_590;
    local_a0 = local_678;
    local_98 = local_678;
    local_90 = local_678;
    local_88 = local_678;
    local_50 = local_670;
    local_48 = local_670;
    local_40 = local_670;
    local_38 = local_670;
    local_660 = local_100._0_16_;
    auStack_650 = local_100._16_16_;
    local_6c0 = local_80._0_16_;
    auStack_6b0 = local_80._16_16_;
    local_6e0 = local_80._0_16_;
    auStack_6d0 = local_80._16_16_;
    local_708 = parasail_result_new();
    if (local_708 == (parasail_result_t *)0x0) {
      local_5a8 = (parasail_result_t *)0x0;
    }
    else {
      local_708->flag = local_708->flag | 0x4800801;
      local_608 = parasail_memalign___m256i(0x20,(long)local_5f0);
      local_610 = parasail_memalign___m256i(0x20,(long)local_5f0);
      local_618 = parasail_memalign___m256i(0x20,(long)local_5f0);
      local_620 = parasail_memalign_int64_t(0x20,(long)(local_5bc + 1));
      if (local_608 == (__m256i *)0x0) {
        local_5a8 = (parasail_result_t *)0x0;
      }
      else if (local_610 == (__m256i *)0x0) {
        local_5a8 = (parasail_result_t *)0x0;
      }
      else if (local_618 == (__m256i *)0x0) {
        local_5a8 = (parasail_result_t *)0x0;
      }
      else if (local_620 == (int64_t *)0x0) {
        local_5a8 = (parasail_result_t *)0x0;
      }
      else {
        local_70c = 0;
        local_5c8 = 0;
        while( true ) {
          if (local_5f0 <= local_5c8) break;
          for (local_710 = 0; local_710 < local_5ec; local_710 = local_710 + 1) {
            local_838 = (long)(-(local_5c4 * (local_710 * local_5f0 + local_5c8)) - local_5c0);
            local_830 = local_838;
            if (local_838 < -0x8000000000000000) {
              local_830 = -0x8000000000000000;
            }
            local_740[local_710] = local_830;
            local_838 = local_838 - local_5c0;
            if (local_838 < -0x8000000000000000) {
              local_838 = -0x8000000000000000;
            }
            local_760[local_710] = local_838;
          }
          local_448 = local_608 + local_70c;
          (*local_448)[0] = local_740[0];
          (*local_448)[1] = local_740[1];
          (*local_448)[2] = local_740[2];
          (*local_448)[3] = local_740[3];
          local_488 = local_618 + local_70c;
          (*local_488)[0] = local_760[0];
          (*local_488)[1] = local_760[1];
          (*local_488)[2] = local_760[2];
          (*local_488)[3] = local_760[3];
          local_70c = local_70c + 1;
          local_5c8 = local_5c8 + 1;
        }
        *local_620 = 0;
        for (local_5c8 = 1; local_5c8 <= local_5bc; local_5c8 = local_5c8 + 1) {
          local_840 = (int64_t)(-(local_5c4 * (local_5c8 + -1)) - local_5c0);
          if (local_840 < -0x8000000000000000) {
            local_840 = -0x8000000000000000;
          }
          local_620[local_5c8] = local_840;
        }
        local_5cc = 0;
        while( true ) {
          palVar40 = local_610;
          if (local_5bc <= local_5cc) break;
          local_7c0._8_8_ = uStack_698;
          local_7c0._0_8_ = local_6a0;
          local_7c0._16_8_ = uStack_690;
          local_7c0._24_8_ = uStack_688;
          auVar1 = vpermq_avx2((undefined1  [32])local_608[local_5f0 + -1],0x90);
          auVar1 = vpblendd_avx2(auVar1,ZEXT1632(ZEXT816(0) << 0x40),3);
          lVar16 = local_600 +
                   (long)(*(int *)(*(long *)(local_5e8 + 0x10) +
                                  (ulong)*(byte *)(local_5b8 + local_5cc) * 4) * local_5f0) * 0x20;
          local_610 = local_608;
          local_608 = palVar40;
          auVar1 = vpblendd_avx2(auVar1,ZEXT832((ulong)local_620[local_5cc]),3);
          lVar18 = auVar1._0_8_;
          lVar26 = auVar1._8_8_;
          lVar28 = auVar1._16_8_;
          lStack_7c8 = auVar1._24_8_;
          local_848 = in_stack_fffffffffffff800;
          for (local_5c8 = 0; local_5c8 < local_5f0; local_5c8 = local_5c8 + 1) {
            local_3c8 = (undefined1 (*) [32])(lVar16 + (long)local_5c8 * 0x20);
            local_440 = *(undefined8 *)*local_3c8;
            uStack_438 = *(undefined8 *)(*local_3c8 + 8);
            uStack_430 = *(undefined8 *)(*local_3c8 + 0x10);
            uStack_428 = *(undefined8 *)(*local_3c8 + 0x18);
            lStack_408 = lStack_7c8;
            auVar1._8_8_ = lVar26;
            auVar1._0_8_ = lVar18;
            auVar1._16_8_ = lVar28;
            auVar1._24_8_ = lStack_7c8;
            auVar1 = vpaddq_avx2(auVar1,*local_3c8);
            lVar17 = auVar1._0_8_;
            lVar25 = auVar1._8_8_;
            lVar27 = auVar1._16_8_;
            lStack_7c8 = auVar1._24_8_;
            local_3d0 = local_618 + local_5c8;
            auVar15 = *(undefined1 (*) [24])*local_3d0;
            lVar29 = (*local_3d0)[3];
            alVar3 = *local_3d0;
            a[1] = lVar17;
            a[0] = lVar16;
            a[2] = lVar25;
            a[3] = lVar27;
            b[1] = local_848;
            b[0] = in_stack_fffffffffffff7f8;
            b[2] = in_stack_fffffffffffff808;
            b[3] = (longlong)palVar40;
            local_420 = lVar18;
            lStack_418 = lVar26;
            lStack_410 = lVar28;
            _mm256_max_epi64_rpl(a,b);
            a_00[1] = lVar17;
            a_00[0] = lVar16;
            a_00[2] = lVar25;
            a_00[3] = lVar27;
            b_00[1] = local_848;
            b_00[0] = in_stack_fffffffffffff7f8;
            b_00[2] = in_stack_fffffffffffff808;
            b_00[3] = (longlong)palVar40;
            _mm256_max_epi64_rpl(a_00,b_00);
            local_4c8 = local_608 + local_5c8;
            (*local_4c8)[0] = lVar17;
            (*local_4c8)[1] = lVar25;
            (*local_4c8)[2] = lVar27;
            (*local_4c8)[3] = lStack_7c8;
            a_01[1] = lVar17;
            a_01[0] = lVar16;
            a_01[2] = lVar25;
            a_01[3] = lVar27;
            b_01[1] = local_848;
            b_01[0] = in_stack_fffffffffffff7f8;
            b_01[2] = in_stack_fffffffffffff808;
            b_01[3] = (longlong)palVar40;
            local_500 = lVar17;
            lStack_4f8 = lVar25;
            lStack_4f0 = lVar27;
            lStack_4e8 = lStack_7c8;
            _mm256_max_epi64_rpl(a_01,b_01);
            a_02[1] = lVar17;
            a_02[0] = lVar16;
            a_02[2] = lVar25;
            a_02[3] = lVar27;
            b_02[1] = local_848;
            b_02[0] = in_stack_fffffffffffff7f8;
            b_02[2] = in_stack_fffffffffffff808;
            b_02[3] = (longlong)palVar40;
            auVar19 = local_6e0;
            auVar20 = auStack_6d0;
            _mm256_min_epi64_rpl(a_02,b_02);
            a_03[1] = lVar17;
            a_03[0] = lVar16;
            a_03[2] = lVar25;
            a_03[3] = lVar27;
            b_03[1] = local_848;
            b_03[0] = in_stack_fffffffffffff7f8;
            b_03[2] = in_stack_fffffffffffff808;
            b_03[3] = (longlong)palVar40;
            local_6e0 = auVar19;
            auStack_6d0 = auVar20;
            _mm256_min_epi64_rpl(a_03,b_03);
            a_04[1] = lVar17;
            a_04[0] = lVar16;
            a_04[2] = lVar25;
            a_04[3] = lVar27;
            b_04[1] = local_848;
            b_04[0] = in_stack_fffffffffffff7f8;
            b_04[2] = in_stack_fffffffffffff808;
            b_04[3] = (longlong)palVar40;
            local_6e0 = auVar19;
            auStack_6d0 = auVar20;
            _mm256_min_epi64_rpl(a_04,b_04);
            local_2c0 = local_640;
            uStack_2b8 = uStack_638;
            uStack_2b0 = uStack_630;
            uStack_2a8 = uStack_628;
            auVar10._8_8_ = lVar25;
            auVar10._0_8_ = lVar17;
            auVar10._16_8_ = lVar27;
            auVar10._24_8_ = lStack_7c8;
            auVar9._8_8_ = uStack_638;
            auVar9._0_8_ = local_640;
            auVar9._16_8_ = uStack_630;
            auVar9._24_8_ = uStack_628;
            auVar1 = vpsubq_avx2(auVar10,auVar9);
            uVar41 = auVar1._0_8_;
            uVar42 = auVar1._8_8_;
            lVar18 = auVar1._16_8_;
            local_7a0 = auVar15._0_8_;
            lStack_798 = auVar15._8_8_;
            lStack_790 = auVar15._16_8_;
            local_2e0 = local_7a0;
            uStack_2d8 = lStack_798;
            uStack_2d0 = lStack_790;
            auVar8._16_8_ = auStack_650._0_8_;
            auVar8._0_16_ = local_660;
            auVar8._24_8_ = auStack_650._8_8_;
            auVar1 = vpsubq_avx2((undefined1  [32])alVar3,auVar8);
            local_7a0 = auVar1._0_8_;
            lStack_798 = auVar1._8_8_;
            lStack_790 = auVar1._16_8_;
            lStack_788 = auVar1._24_8_;
            a_05[1] = uVar41;
            a_05[0] = lVar16;
            a_05[2] = uVar42;
            a_05[3] = lVar18;
            alVar3[1] = local_848;
            alVar3[0] = in_stack_fffffffffffff7f8;
            alVar3[2] = in_stack_fffffffffffff808;
            alVar3[3] = (longlong)palVar40;
            lStack_2c8 = lVar29;
            local_2a0 = lVar17;
            lStack_298 = lVar25;
            lStack_290 = lVar27;
            lStack_288 = lStack_7c8;
            local_300 = local_660;
            auStack_2f0 = auStack_650;
            local_6e0 = auVar19;
            auStack_6d0 = auVar20;
            _mm256_max_epi64_rpl(a_05,alVar3);
            local_508 = local_618 + local_5c8;
            (*local_508)[0] = local_7a0;
            (*local_508)[1] = lStack_798;
            (*local_508)[2] = lStack_790;
            (*local_508)[3] = lStack_788;
            local_320 = local_7c0._0_8_;
            uStack_318 = local_7c0._8_8_;
            uStack_310 = local_7c0._16_8_;
            uStack_308 = local_7c0._24_8_;
            auVar7._16_8_ = auStack_650._0_8_;
            auVar7._0_16_ = local_660;
            auVar7._24_8_ = auStack_650._8_8_;
            auVar1 = vpsubq_avx2(local_7c0,auVar7);
            local_7c0._0_8_ = auVar1._0_8_;
            local_7c0._8_8_ = auVar1._8_8_;
            local_7c0._16_8_ = auVar1._16_8_;
            local_7c0._24_8_ = auVar1._24_8_;
            a_06[1] = uVar41;
            a_06[0] = lVar16;
            a_06[2] = uVar42;
            a_06[3] = lVar18;
            b_05[1] = local_848;
            b_05[0] = in_stack_fffffffffffff7f8;
            b_05[2] = in_stack_fffffffffffff808;
            b_05[3] = (longlong)palVar40;
            local_540 = local_7a0;
            lStack_538 = lStack_798;
            lStack_530 = lStack_790;
            lStack_528 = lStack_788;
            local_340 = local_660;
            auStack_330 = auStack_650;
            _mm256_max_epi64_rpl(a_06,b_05);
            local_3d8 = local_610 + local_5c8;
            lVar18 = (*local_3d8)[0];
            lVar26 = (*local_3d8)[1];
            lVar28 = (*local_3d8)[2];
            lStack_7c8 = (*local_3d8)[3];
          }
          for (local_5d0 = 0; local_5d0 < local_5ec; local_5d0 = local_5d0 + 1) {
            in_stack_fffffffffffff808 = local_620[local_5cc + 1] - (long)local_5c0;
            local_848 = in_stack_fffffffffffff808;
            if ((long)in_stack_fffffffffffff808 < -0x8000000000000000) {
              local_848 = 0x8000000000000000;
            }
            auVar1 = vpermq_avx2(local_7c0,0x90);
            auVar1 = vpblendd_avx2(auVar1,ZEXT1632(ZEXT816(0) << 0x40),3);
            local_7c0 = vpblendd_avx2(auVar1,ZEXT832(local_848),3);
            for (local_5c8 = 0; local_5c8 < local_5f0; local_5c8 = local_5c8 + 1) {
              local_3e0 = local_608 + local_5c8;
              lVar18 = (*local_3e0)[0];
              lVar26 = (*local_3e0)[1];
              lVar28 = (*local_3e0)[2];
              lVar29 = (*local_3e0)[3];
              a_07[1] = lVar18;
              a_07[0] = lVar16;
              a_07[2] = lVar26;
              a_07[3] = lVar28;
              b_06[1] = local_848;
              b_06[0] = in_stack_fffffffffffff7f8;
              b_06[2] = in_stack_fffffffffffff808;
              b_06[3] = (longlong)palVar40;
              _mm256_max_epi64_rpl(a_07,b_06);
              local_548 = local_608 + local_5c8;
              (*local_548)[0] = lVar18;
              (*local_548)[1] = lVar26;
              (*local_548)[2] = lVar28;
              (*local_548)[3] = lVar29;
              a_08[1] = lVar18;
              a_08[0] = lVar16;
              a_08[2] = lVar26;
              a_08[3] = lVar28;
              b_07[1] = local_848;
              b_07[0] = in_stack_fffffffffffff7f8;
              b_07[2] = in_stack_fffffffffffff808;
              b_07[3] = (longlong)palVar40;
              local_580 = lVar18;
              lStack_578 = lVar26;
              lStack_570 = lVar28;
              lStack_568 = lVar29;
              auVar19 = local_6e0;
              auVar20 = auStack_6d0;
              _mm256_min_epi64_rpl(a_08,b_07);
              a_09[1] = lVar18;
              a_09[0] = lVar16;
              a_09[2] = lVar26;
              a_09[3] = lVar28;
              b_08[1] = local_848;
              b_08[0] = in_stack_fffffffffffff7f8;
              b_08[2] = in_stack_fffffffffffff808;
              b_08[3] = (longlong)palVar40;
              local_6e0 = auVar19;
              auStack_6d0 = auVar20;
              _mm256_max_epi64_rpl(a_09,b_08);
              local_380 = local_640;
              uStack_378 = uStack_638;
              uStack_370 = uStack_630;
              uStack_368 = uStack_628;
              auVar6._8_8_ = lVar26;
              auVar6._0_8_ = lVar18;
              auVar6._16_8_ = lVar28;
              auVar6._24_8_ = lVar29;
              auVar5._8_8_ = uStack_638;
              auVar5._0_8_ = local_640;
              auVar5._16_8_ = uStack_630;
              auVar5._24_8_ = uStack_628;
              auVar1 = vpsubq_avx2(auVar6,auVar5);
              local_1c0 = auVar1._0_8_;
              uStack_1b8 = auVar1._8_8_;
              uStack_1b0 = auVar1._16_8_;
              lStack_7c8 = auVar1._24_8_;
              local_3a0 = local_7c0._0_8_;
              uStack_398 = local_7c0._8_8_;
              uStack_390 = local_7c0._16_8_;
              uStack_388 = local_7c0._24_8_;
              auVar4._16_8_ = auStack_650._0_8_;
              auVar4._0_16_ = local_660;
              auVar4._24_8_ = auStack_650._8_8_;
              local_7c0 = vpsubq_avx2(local_7c0,auVar4);
              local_1a0 = local_7c0._0_8_;
              uStack_198 = local_7c0._8_8_;
              uStack_190 = local_7c0._16_8_;
              uStack_188 = local_7c0._24_8_;
              uStack_1a8 = lStack_7c8;
              local_260 = vpcmpgtq_avx2(local_7c0,auVar1);
              local_360 = lVar18;
              lStack_358 = lVar26;
              lStack_350 = lVar28;
              lStack_348 = lVar29;
              auStack_3b0 = auStack_650;
              local_3c0 = local_660;
              if ((((((((((((((((((((((((((((((((local_260 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (local_260 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (local_260 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (local_260 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (local_260 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (local_260 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (local_260 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (local_260 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (local_260 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (local_260 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (local_260 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (local_260 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_260 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (local_260 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_260 >> 0x77 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_260 >> 0x7f,0) == '\0') &&
                                (local_260 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_260 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_260 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_260 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_260 >> 0xa7 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_260 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_260 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_260 >> 0xbf,0) == '\0') &&
                        (local_260 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (local_260 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_260 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (local_260 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_260 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_260 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_260 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < local_260[0x1f]) goto LAB_00bbe5a4;
            }
          }
LAB_00bbe5a4:
          local_5cc = local_5cc + 1;
          in_stack_fffffffffffff800 = local_848;
        }
        local_3e8 = local_608 + local_5f4;
        local_820 = (*local_3e8)[0];
        lStackY_818 = (*local_3e8)[1];
        lStackY_810 = (*local_3e8)[2];
        local_678 = (*local_3e8)[3];
        for (local_5d0 = 0; local_5d0 < local_5f8; local_5d0 = local_5d0 + 1) {
          auVar2._8_8_ = lStackY_818;
          auVar2._0_8_ = local_820;
          auVar2._16_8_ = lStackY_810;
          auVar2._24_8_ = local_678;
          auVar1 = vpermq_avx2(auVar2,0x90);
          auVar1 = vpblendd_avx2(auVar1,ZEXT1632(ZEXT816(0) << 0x40),3);
          local_820 = auVar1._0_8_;
          lStackY_818 = auVar1._8_8_;
          lStackY_810 = auVar1._16_8_;
          local_678 = auVar1._24_8_;
        }
        local_1e0 = local_6a0;
        uStack_1d8 = uStack_698;
        uStack_1d0 = uStack_690;
        uStack_1c8 = uStack_688;
        auVar14._8_8_ = uStack_698;
        auVar14._0_8_ = local_6a0;
        auVar14._16_8_ = uStack_690;
        auVar14._24_8_ = uStack_688;
        auVar13._16_8_ = auStack_6d0._0_8_;
        auVar13._0_16_ = local_6e0;
        auVar13._24_8_ = auStack_6d0._8_8_;
        local_160 = vpcmpgtq_avx2(auVar14,auVar13);
        local_220 = local_700;
        uStack_218 = uStack_6f8;
        uStack_210 = uStack_6f0;
        uStack_208 = uStack_6e8;
        auVar12._8_8_ = uStack_6f8;
        auVar12._0_8_ = local_700;
        auVar12._16_8_ = uStack_6f0;
        auVar12._24_8_ = uStack_6e8;
        auVar11._16_8_ = auStack_6b0._0_8_;
        auVar11._0_16_ = local_6c0;
        auVar11._24_8_ = auStack_6b0._8_8_;
        local_180 = vpcmpgtq_avx2(auVar12,auVar11);
        local_280 = vpor_avx2(local_160,local_180);
        if ((((((((((((((((((((((((((((((((local_280 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_280 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_280 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_280 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_280 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_280 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_280 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_280 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_280 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_280 >> 0x4f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_280 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_280 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_280 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (local_280 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             ) || (local_280 >> 0x77 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(local_280 >> 0x7f,0) != '\0') ||
                          (local_280 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_280 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_280 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_280 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_280 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_280 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_280 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_280 >> 0xbf,0) != '\0') ||
                  (local_280 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_280 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_280 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_280 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_280 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_280 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_280 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_280[0x1f] < '\0') {
          local_708->flag = local_708->flag | 0x40;
          local_678 = 0;
          local_5d8 = 0;
          local_5dc = 0;
        }
        local_708->score = (int)local_678;
        local_708->end_query = local_5d8;
        local_708->end_ref = local_5dc;
        local_240 = local_6c0;
        auStack_230 = auStack_6b0;
        local_200 = local_6e0;
        auStack_1f0 = auStack_6d0;
        parasail_free(local_620);
        parasail_free(local_618);
        parasail_free(local_610);
        parasail_free(local_608);
        local_5a8 = local_708;
      }
    }
  }
  return local_5a8;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}